

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaTypeFixupOptimFacets(xmlSchemaTypePtr type)

{
  byte *pbVar1;
  xmlSchemaTypeType xVar2;
  int iVar3;
  xmlSchemaTypePtr pxVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  xmlSchemaFacetPtr fac;
  xmlSchemaFacetPtr pxVar9;
  
  pxVar9 = type->facets;
  uVar8 = type->baseType->flags;
  uVar6 = uVar8 >> 0x1b;
  uVar7 = uVar6 & 1;
  uVar5 = uVar8 >> 0x15 & uVar6 & 1;
  uVar8 = uVar8 >> 0x1c & uVar6 & 1;
  do {
    if (pxVar9 == (xmlSchemaFacetPtr)0x0) {
      if (uVar8 != 0) {
        pbVar1 = (byte *)((long)&type->flags + 3);
        *pbVar1 = *pbVar1 | 0x10;
      }
      if (uVar5 != 0) {
        pbVar1 = (byte *)((long)&type->flags + 2);
        *pbVar1 = *pbVar1 | 0x20;
      }
      if (uVar7 != 0) {
        pbVar1 = (byte *)((long)&type->flags + 3);
        *pbVar1 = *pbVar1 | 8;
      }
      if ((uVar5 == 0 && uVar7 != 0) && (((uint)type->flags >> 8 & 1) != 0)) {
        iVar3 = type->builtInType;
        pxVar4 = type;
        while ((iVar3 != 0x2e && ((pxVar4->flags & 0x4000) == 0))) {
          pxVar4 = pxVar4->baseType;
          iVar3 = pxVar4->builtInType;
        }
        if ((pxVar4->builtInType != 1) && (pxVar4->builtInType != 0x2e)) {
          type->flags = type->flags | 0x200000;
        }
      }
      return;
    }
    xVar2 = pxVar9->type;
    if (xVar2 != XML_SCHEMA_FACET_WHITESPACE) {
      if (xVar2 == XML_SCHEMA_FACET_ENUMERATION) {
        uVar5 = 1;
LAB_001c1321:
        uVar8 = 1;
      }
      else if (xVar2 == XML_SCHEMA_FACET_PATTERN) goto LAB_001c1321;
      uVar7 = 1;
    }
    pxVar9 = pxVar9->next;
  } while( true );
}

Assistant:

static void
xmlSchemaTypeFixupOptimFacets(xmlSchemaTypePtr type)
{
    int has = 0, needVal = 0, normVal = 0;

    has	= (type->baseType->flags & XML_SCHEMAS_TYPE_HAS_FACETS) ? 1 : 0;
    if (has) {
	needVal = (type->baseType->flags &
	    XML_SCHEMAS_TYPE_FACETSNEEDVALUE) ? 1 : 0;
	normVal = (type->baseType->flags &
	    XML_SCHEMAS_TYPE_NORMVALUENEEDED) ? 1 : 0;
    }
    if (type->facets != NULL) {
	xmlSchemaFacetPtr fac;

	for (fac = type->facets; fac != NULL; fac = fac->next) {
	    switch (fac->type) {
		case XML_SCHEMA_FACET_WHITESPACE:
		    break;
		case XML_SCHEMA_FACET_PATTERN:
		    normVal = 1;
		    has = 1;
		    break;
		case XML_SCHEMA_FACET_ENUMERATION:
		    needVal = 1;
		    normVal = 1;
		    has = 1;
		    break;
		default:
		    has = 1;
		    break;
	    }
	}
    }
    if (normVal)
	type->flags |= XML_SCHEMAS_TYPE_NORMVALUENEEDED;
    if (needVal)
	type->flags |= XML_SCHEMAS_TYPE_FACETSNEEDVALUE;
    if (has)
	type->flags |= XML_SCHEMAS_TYPE_HAS_FACETS;

    if (has && (! needVal) && WXS_IS_ATOMIC(type)) {
	xmlSchemaTypePtr prim = xmlSchemaGetPrimitiveType(type);
	/*
	* OPTIMIZE VAL TODO: Some facets need a computed value.
	*/
	if ((prim->builtInType != XML_SCHEMAS_ANYSIMPLETYPE) &&
	    (prim->builtInType != XML_SCHEMAS_STRING)) {
	    type->flags |= XML_SCHEMAS_TYPE_FACETSNEEDVALUE;
	}
    }
}